

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

bool __thiscall UniValue::findKey(UniValue *this,string *key,size_t *retIdx)

{
  pointer pbVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  size_type *psVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  
  pbVar1 = (this->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar4 == 0) {
    bVar7 = false;
  }
  else {
    uVar5 = lVar4 >> 5;
    __s2 = (key->_M_dataplus)._M_p;
    __n = key->_M_string_length;
    psVar3 = &pbVar1->_M_string_length;
    bVar7 = true;
    sVar6 = 0;
    do {
      if ((*psVar3 == __n) &&
         ((__n == 0 ||
          (iVar2 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar3 + -1))->_M_dataplus)._M_p,__s2,__n), iVar2 == 0)))) {
        *retIdx = sVar6;
        return bVar7;
      }
      sVar6 = sVar6 + 1;
      bVar7 = sVar6 < uVar5;
      psVar3 = psVar3 + 4;
    } while (uVar5 + (uVar5 == 0) != sVar6);
  }
  return bVar7;
}

Assistant:

bool UniValue::findKey(const std::string& key, size_t& retIdx) const
{
    for (size_t i = 0; i < keys.size(); i++) {
        if (keys[i] == key) {
            retIdx = i;
            return true;
        }
    }

    return false;
}